

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

void __thiscall
QAbstractProxyModelPrivate::mapDropCoordinatesToSource
          (QAbstractProxyModelPrivate *this,int row,int column,QModelIndex *parent,int *sourceRow,
          int *sourceColumn,QModelIndex *sourceParent)

{
  int iVar1;
  int iVar2;
  QModelIndex *this_00;
  arrow_operator_result ppQVar3;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  QAbstractProxyModelPrivate *in_RDI;
  int *in_R8;
  int *in_R9;
  long in_FS_OFFSET;
  undefined8 *in_stack_00000008;
  QAbstractProxyModel *q;
  QModelIndex sourceIndex;
  QModelIndex proxyIndex;
  undefined4 in_stack_ffffffffffffff40;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QModelIndex *)q_func(in_RDI);
  *in_R8 = -1;
  *in_R9 = -1;
  if ((in_ESI == -1) && (in_EDX == -1)) {
    (**(code **)(*(long *)this_00 + 400))(&local_20,this_00,in_RCX);
    *in_stack_00000008 = local_20;
    in_stack_00000008[1] = local_18;
    in_stack_00000008[2] = local_10;
  }
  else {
    iVar2 = in_ESI;
    iVar1 = (**(code **)(*(long *)this_00 + 0x78))(this_00,in_RCX);
    if (iVar2 == iVar1) {
      (**(code **)(*(long *)this_00 + 400))(&local_38,this_00,in_RCX);
      *in_stack_00000008 = local_38;
      in_stack_00000008[1] = local_30;
      in_stack_00000008[2] = local_28;
      ppQVar3 = QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                ::operator->((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                              *)CONCAT44(iVar2,in_stack_ffffffffffffff40));
      iVar2 = (*((*ppQVar3)->super_QObject)._vptr_QObject[0xf])(*ppQVar3,in_stack_00000008);
      *in_R8 = iVar2;
    }
    else {
      local_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)this_00 + 0x60))(&local_50,this_00,in_ESI,in_EDX,in_RCX);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      (**(code **)(*(long *)this_00 + 400))(&local_68,this_00,&local_50);
      iVar2 = QModelIndex::row((QModelIndex *)&local_68);
      *in_R8 = iVar2;
      iVar2 = QModelIndex::column((QModelIndex *)&local_68);
      *in_R9 = iVar2;
      QModelIndex::parent(this_00);
      *in_stack_00000008 = local_80;
      in_stack_00000008[1] = local_78;
      in_stack_00000008[2] = local_70;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractProxyModelPrivate::mapDropCoordinatesToSource(int row, int column, const QModelIndex &parent,
                                                            int *sourceRow, int *sourceColumn, QModelIndex *sourceParent) const
{
    Q_Q(const QAbstractProxyModel);
    *sourceRow = -1;
    *sourceColumn = -1;
    if (row == -1 && column == -1) {
        *sourceParent = q->mapToSource(parent);
    } else if (row == q->rowCount(parent)) {
        *sourceParent = q->mapToSource(parent);
        *sourceRow = model->rowCount(*sourceParent);
    } else {
        QModelIndex proxyIndex = q->index(row, column, parent);
        QModelIndex sourceIndex = q->mapToSource(proxyIndex);
        *sourceRow = sourceIndex.row();
        *sourceColumn = sourceIndex.column();
        *sourceParent = sourceIndex.parent();
    }
}